

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_client.cpp
# Opt level: O0

bool tcp_send(char *command,uint8_t command_length)

{
  uint16_t uVar1;
  int iVar2;
  ssize_t sVar3;
  uint8_t local_2f [3];
  undefined1 local_2c;
  undefined1 local_2b;
  uint16_t local_2a;
  uint8_t response [5];
  uint8_t *puStack_28;
  uint16_t crc;
  uint8_t *data;
  uint8_t command_length_local;
  char *command_local;
  
  puStack_28 = (uint8_t *)operator_new__((long)(int)(command_length + 2));
  strncpy((char *)puStack_28,command,(ulong)command_length);
  local_2a = crc16(puStack_28,command_length);
  puStack_28[command_length] = (uint8_t)local_2a;
  puStack_28[(int)(command_length + 1)] = (uint8_t)(local_2a >> 8);
  sVar3 = send(tcp_socket,puStack_28,(long)(int)(command_length + 2),0);
  if (sVar3 == (int)(command_length + 2)) {
    if (puStack_28 != (uint8_t *)0x0) {
      operator_delete(puStack_28);
    }
    sVar3 = recv(tcp_socket,local_2f,5,0);
    if (sVar3 == 5) {
      uVar1 = crc16(local_2f,'\x03');
      if (CONCAT11(local_2b,local_2c) == uVar1) {
        iVar2 = strncmp("yup",(char *)local_2f,3);
        if (iVar2 == 0) {
          command_local._7_1_ = true;
        }
        else {
          command_local._7_1_ = false;
        }
      }
      else {
        command_local._7_1_ = false;
      }
    }
    else {
      command_local._7_1_ = false;
    }
  }
  else {
    if (puStack_28 != (uint8_t *)0x0) {
      operator_delete(puStack_28);
    }
    command_local._7_1_ = false;
  }
  return command_local._7_1_;
}

Assistant:

bool tcp_send(const char *command, uint8_t command_length)
{
    uint8_t *data = new uint8_t[command_length + 2];
    strncpy((char*)data, command, command_length);

    uint16_t crc = crc16(data, command_length);

    data[command_length] = crc & 0xFF;
    data[command_length + 1] = crc >> 8;

    if (send(tcp_socket, data, command_length + 2, 0) != command_length + 2)
    {
        delete data;
        return false;
    }

    delete data;

    uint8_t response[5];

    if (recv(tcp_socket, response, 5, 0) != 5)
        return false;

    crc = response[4] << 8;
    crc |= response[3];

    if (crc != crc16(response, 3))
        return false;

    if (strncmp("yup", (char*)response, 3) != 0)
        return false;

    return true;
}